

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int acmod_read_scores_internal(acmod_t *acmod)

{
  FILE *__stream;
  int16 *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined8 in_RAX;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int iVar19;
  undefined1 auVar17 [16];
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar31;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  int16 n_active;
  short local_22;
  
  local_22 = (short)((ulong)in_RAX >> 0x30);
  __stream = (FILE *)acmod->insenfh;
  if (acmod->n_feat_frame == acmod->n_feat_alloc) {
    if (acmod->grow_feat == '\0') {
      return 0;
    }
    acmod_grow_feat_buf(acmod,acmod->n_feat_frame * 2);
  }
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  sVar8 = fread(&local_22,2,1,__stream);
  if (sVar8 == 1) {
    acmod->n_senone_active = (int)local_22;
    if (acmod->mdef->n_sen == (int)local_22) {
      sVar8 = fread(acmod->senone_scores,2,(long)local_22,__stream);
      if (sVar8 == (long)acmod->n_senone_active) {
        return 1;
      }
    }
    else {
      sVar8 = fread(acmod->senone_active,1,(long)local_22,__stream);
      if (sVar8 == (long)acmod->n_senone_active) {
        if (acmod->n_senone_active < 1) {
          uVar15 = 0;
        }
        else {
          lVar16 = 0;
          in_XMM12._8_4_ = 0xffffffff;
          in_XMM12._0_8_ = 0xffffffffffffffff;
          in_XMM12._12_4_ = 0xffffffff;
          uVar9 = 0;
          do {
            auVar6 = _DAT_00153ac0;
            auVar5 = _DAT_00153ab0;
            auVar4 = _DAT_00153aa0;
            auVar3 = _DAT_00152bb0;
            auVar2 = _DAT_00152ba0;
            piVar1 = acmod->senone_scores;
            uVar15 = uVar9 + acmod->senone_active[lVar16];
            uVar10 = (ulong)uVar15;
            if (1 < acmod->senone_active[lVar16]) {
              uVar11 = (ulong)uVar9;
              uVar14 = uVar11 + 2;
              if (uVar11 + 2 <= uVar10) {
                uVar14 = uVar10;
              }
              lVar12 = ~uVar11 + uVar14 + -1;
              auVar17._8_4_ = (int)lVar12;
              auVar17._0_8_ = lVar12;
              auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
              auVar17 = auVar17 ^ _DAT_00152bb0;
              uVar13 = 0;
              do {
                auVar21._8_4_ = (int)uVar13;
                auVar21._0_8_ = uVar13;
                auVar21._12_4_ = (int)(uVar13 >> 0x20);
                auVar22 = (auVar21 | auVar2) ^ auVar3;
                iVar7 = auVar17._0_4_;
                iVar32 = -(uint)(iVar7 < auVar22._0_4_);
                iVar19 = auVar17._4_4_;
                auVar23._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
                iVar31 = auVar17._8_4_;
                iVar34 = -(uint)(iVar31 < auVar22._8_4_);
                iVar20 = auVar17._12_4_;
                auVar23._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
                auVar28._4_4_ = iVar32;
                auVar28._0_4_ = iVar32;
                auVar28._8_4_ = iVar34;
                auVar28._12_4_ = iVar34;
                auVar35 = pshuflw(in_XMM5,auVar28,0xe8);
                auVar26._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
                auVar26._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
                auVar26._0_4_ = auVar26._4_4_;
                auVar26._8_4_ = auVar26._12_4_;
                auVar36 = pshuflw(in_XMM6,auVar26,0xe8);
                auVar23._0_4_ = auVar23._4_4_;
                auVar23._8_4_ = auVar23._12_4_;
                auVar22 = pshuflw(auVar35,auVar23,0xe8);
                auVar22 = (auVar22 | auVar36 & auVar35) ^ in_XMM12;
                auVar22 = packssdw(auVar22,auVar22);
                if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 1] = 0x7fff;
                }
                auVar23 = auVar26 & auVar28 | auVar23;
                auVar22 = packssdw(auVar23,auVar23);
                auVar22 = packssdw(auVar22 ^ in_XMM12,auVar22 ^ in_XMM12);
                if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
                  piVar1[uVar11 + uVar13 + 2] = 0x7fff;
                }
                auVar26 = (auVar21 | auVar6) ^ auVar3;
                iVar32 = -(uint)(iVar7 < auVar26._0_4_);
                auVar33._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
                iVar34 = -(uint)(iVar31 < auVar26._8_4_);
                auVar33._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
                auVar22._4_4_ = iVar32;
                auVar22._0_4_ = iVar32;
                auVar22._8_4_ = iVar34;
                auVar22._12_4_ = iVar34;
                auVar27._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
                auVar27._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar33._0_4_ = auVar33._4_4_;
                auVar33._8_4_ = auVar33._12_4_;
                auVar26 = auVar27 & auVar22 | auVar33;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packssdw(auVar26 ^ in_XMM12,auVar26 ^ in_XMM12);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 3] = 0x7fff;
                }
                auVar22 = pshufhw(auVar22,auVar22,0x84);
                auVar28 = pshufhw(auVar27,auVar27,0x84);
                auVar23 = pshufhw(auVar22,auVar33,0x84);
                auVar22 = (auVar23 | auVar28 & auVar22) ^ in_XMM12;
                auVar22 = packssdw(auVar22,auVar22);
                if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 4] = 0x7fff;
                }
                auVar22 = (auVar21 | auVar5) ^ auVar3;
                iVar32 = -(uint)(iVar7 < auVar22._0_4_);
                auVar25._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
                iVar34 = -(uint)(iVar31 < auVar22._8_4_);
                auVar25._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
                auVar29._4_4_ = iVar32;
                auVar29._0_4_ = iVar32;
                auVar29._8_4_ = iVar34;
                auVar29._12_4_ = iVar34;
                auVar26 = pshuflw(auVar26,auVar29,0xe8);
                auVar24._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
                auVar24._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
                auVar24._0_4_ = auVar24._4_4_;
                auVar24._8_4_ = auVar24._12_4_;
                in_XMM6 = pshuflw(auVar36 & auVar35,auVar24,0xe8);
                in_XMM6 = in_XMM6 & auVar26;
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar22 = pshuflw(auVar26,auVar25,0xe8);
                auVar22 = (auVar22 | in_XMM6) ^ in_XMM12;
                in_XMM5 = packssdw(auVar22,auVar22);
                if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 5] = 0x7fff;
                }
                auVar25 = auVar24 & auVar29 | auVar25;
                auVar22 = packssdw(auVar25,auVar25);
                auVar22 = packssdw(auVar22 ^ in_XMM12,auVar22 ^ in_XMM12);
                if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 6] = 0x7fff;
                }
                auVar21 = (auVar21 | auVar4) ^ auVar3;
                iVar7 = -(uint)(iVar7 < auVar21._0_4_);
                auVar30._4_4_ = -(uint)(iVar19 < auVar21._4_4_);
                iVar31 = -(uint)(iVar31 < auVar21._8_4_);
                auVar30._12_4_ = -(uint)(iVar20 < auVar21._12_4_);
                auVar36._4_4_ = iVar7;
                auVar36._0_4_ = iVar7;
                auVar36._8_4_ = iVar31;
                auVar36._12_4_ = iVar31;
                auVar35._4_4_ = -(uint)(auVar21._4_4_ == iVar19);
                auVar35._12_4_ = -(uint)(auVar21._12_4_ == iVar20);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar21 = auVar35 & auVar36 | auVar30;
                auVar21 = packssdw(auVar21,auVar21);
                auVar21 = packssdw(auVar21 ^ in_XMM12,auVar21 ^ in_XMM12);
                if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 7] = 0x7fff;
                }
                auVar22 = pshufhw(auVar36,auVar36,0x84);
                auVar21 = pshufhw(auVar35,auVar35,0x84);
                auVar26 = pshufhw(auVar22,auVar30,0x84);
                auVar21 = packssdw(auVar21 & auVar22,(auVar26 | auVar21 & auVar22) ^ in_XMM12);
                if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  piVar1[uVar11 + uVar13 + 8] = 0x7fff;
                }
                uVar13 = uVar13 + 8;
              } while ((uVar14 + ~uVar11 + 7 & 0xfffffffffffffff8) != uVar13);
            }
            sVar8 = fread(piVar1 + uVar10,2,1,__stream);
            if (sVar8 != 1) goto LAB_0011e973;
            lVar16 = lVar16 + 1;
            in_XMM12._8_4_ = 0xffffffff;
            in_XMM12._0_8_ = 0xffffffffffffffff;
            in_XMM12._12_4_ = 0xffffffff;
            in_XMM11 = _DAT_00152bb0;
            uVar9 = uVar15;
          } while (lVar16 < acmod->n_senone_active);
        }
        auVar6 = _DAT_00153ac0;
        auVar5 = _DAT_00153ab0;
        auVar4 = _DAT_00153aa0;
        auVar3 = _DAT_00152bb0;
        auVar2 = _DAT_00152ba0;
        iVar7 = acmod->mdef->n_sen;
        if ((int)(uVar15 + 1) < iVar7) {
          piVar1 = acmod->senone_scores;
          uVar9 = (iVar7 - uVar15) - 2;
          auVar18._4_4_ = 0;
          auVar18._0_4_ = uVar9;
          auVar18._8_4_ = uVar9;
          auVar18._12_4_ = 0;
          uVar10 = 0;
          auVar18 = auVar18 ^ _DAT_00152bb0;
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          do {
            auVar38._8_4_ = (int)uVar10;
            auVar38._0_8_ = uVar10;
            auVar38._12_4_ = (int)(uVar10 >> 0x20);
            auVar17 = (auVar38 | auVar2) ^ auVar3;
            iVar7 = auVar18._0_4_;
            iVar32 = -(uint)(iVar7 < auVar17._0_4_);
            iVar19 = auVar18._4_4_;
            auVar41._4_4_ = -(uint)(iVar19 < auVar17._4_4_);
            iVar31 = auVar18._8_4_;
            iVar34 = -(uint)(iVar31 < auVar17._8_4_);
            iVar20 = auVar18._12_4_;
            auVar41._12_4_ = -(uint)(iVar20 < auVar17._12_4_);
            auVar46._4_4_ = iVar32;
            auVar46._0_4_ = iVar32;
            auVar46._8_4_ = iVar34;
            auVar46._12_4_ = iVar34;
            auVar21 = pshuflw(in_XMM11,auVar46,0xe8);
            auVar40._4_4_ = -(uint)(auVar17._4_4_ == iVar19);
            auVar40._12_4_ = -(uint)(auVar17._12_4_ == iVar20);
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar22 = pshuflw(in_XMM12,auVar40,0xe8);
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar17 = pshuflw(auVar21,auVar41,0xe8);
            auVar17 = (auVar17 | auVar22 & auVar21) ^ auVar37;
            auVar17 = packssdw(auVar17,auVar17);
            if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 1] = 0x7fff;
            }
            auVar41 = auVar40 & auVar46 | auVar41;
            auVar17 = packssdw(auVar41,auVar41);
            auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
            if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
              piVar1[(ulong)uVar15 + uVar10 + 2] = 0x7fff;
            }
            auVar17 = (auVar38 | auVar6) ^ auVar3;
            iVar32 = -(uint)(iVar7 < auVar17._0_4_);
            auVar50._4_4_ = -(uint)(iVar19 < auVar17._4_4_);
            iVar34 = -(uint)(iVar31 < auVar17._8_4_);
            auVar50._12_4_ = -(uint)(iVar20 < auVar17._12_4_);
            auVar42._4_4_ = iVar32;
            auVar42._0_4_ = iVar32;
            auVar42._8_4_ = iVar34;
            auVar42._12_4_ = iVar34;
            auVar47._4_4_ = -(uint)(auVar17._4_4_ == iVar19);
            auVar47._12_4_ = -(uint)(auVar17._12_4_ == iVar20);
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar17 = auVar47 & auVar42 | auVar50;
            auVar17 = packssdw(auVar17,auVar17);
            auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
            if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 3] = 0x7fff;
            }
            auVar26 = pshufhw(auVar42,auVar42,0x84);
            auVar28 = pshufhw(auVar47,auVar47,0x84);
            auVar23 = pshufhw(auVar26,auVar50,0x84);
            auVar26 = (auVar23 | auVar28 & auVar26) ^ auVar37;
            auVar26 = packssdw(auVar26,auVar26);
            if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 4] = 0x7fff;
            }
            auVar26 = (auVar38 | auVar5) ^ auVar3;
            iVar32 = -(uint)(iVar7 < auVar26._0_4_);
            auVar44._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
            iVar34 = -(uint)(iVar31 < auVar26._8_4_);
            auVar44._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
            auVar48._4_4_ = iVar32;
            auVar48._0_4_ = iVar32;
            auVar48._8_4_ = iVar34;
            auVar48._12_4_ = iVar34;
            auVar17 = pshuflw(auVar17,auVar48,0xe8);
            auVar43._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
            auVar43._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
            auVar43._0_4_ = auVar43._4_4_;
            auVar43._8_4_ = auVar43._12_4_;
            in_XMM12 = pshuflw(auVar22 & auVar21,auVar43,0xe8);
            in_XMM12 = in_XMM12 & auVar17;
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar17 = pshuflw(auVar17,auVar44,0xe8);
            auVar17 = (auVar17 | in_XMM12) ^ auVar37;
            in_XMM11 = packssdw(auVar17,auVar17);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 5] = 0x7fff;
            }
            auVar44 = auVar43 & auVar48 | auVar44;
            auVar17 = packssdw(auVar44,auVar44);
            auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
            if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 6] = 0x7fff;
            }
            auVar17 = (auVar38 | auVar4) ^ auVar3;
            iVar7 = -(uint)(iVar7 < auVar17._0_4_);
            auVar49._4_4_ = -(uint)(iVar19 < auVar17._4_4_);
            iVar31 = -(uint)(iVar31 < auVar17._8_4_);
            auVar49._12_4_ = -(uint)(iVar20 < auVar17._12_4_);
            auVar45._4_4_ = iVar7;
            auVar45._0_4_ = iVar7;
            auVar45._8_4_ = iVar31;
            auVar45._12_4_ = iVar31;
            auVar39._4_4_ = -(uint)(auVar17._4_4_ == iVar19);
            auVar39._12_4_ = -(uint)(auVar17._12_4_ == iVar20);
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar17 = auVar39 & auVar45 | auVar49;
            auVar17 = packssdw(auVar17,auVar17);
            auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
            if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 7] = 0x7fff;
            }
            auVar21 = pshufhw(auVar45,auVar45,0x84);
            auVar17 = pshufhw(auVar39,auVar39,0x84);
            auVar22 = pshufhw(auVar21,auVar49,0x84);
            auVar17 = packssdw(auVar17 & auVar21,(auVar22 | auVar17 & auVar21) ^ auVar37);
            if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              piVar1[(ulong)uVar15 + uVar10 + 8] = 0x7fff;
            }
            uVar10 = uVar10 + 8;
          } while (((ulong)uVar9 + 8 & 0xfffffffffffffff8) != uVar10);
          return 1;
        }
        return 1;
      }
    }
  }
LAB_0011e973:
  iVar7 = ferror(__stream);
  if (iVar7 == 0) {
    return 0;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                 ,0x3d0,"Failed to read frame from senone file");
  return -1;
}

Assistant:

static int
acmod_read_scores_internal(acmod_t *acmod)
{
    FILE *senfh = acmod->insenfh;
    int16 n_active;
    size_t rv;

    if (acmod->n_feat_frame == acmod->n_feat_alloc) {
        if (acmod->grow_feat)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
        else
            return 0;
    }

    if (senfh == NULL)
        return -1;
    
    if ((rv = fread(&n_active, 2, 1, senfh)) != 1)
        goto error_out;

    acmod->n_senone_active = n_active;
    if (acmod->n_senone_active == bin_mdef_n_sen(acmod->mdef)) {
        if ((rv = fread(acmod->senone_scores, 2,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;
    }
    else {
        int i, n;
        
        if ((rv = fread(acmod->senone_active, 1,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;

        for (i = 0, n = 0; i < acmod->n_senone_active; ++i) {
            int j, sen = n + acmod->senone_active[i];
            for (j = n + 1; j < sen; ++j)
                acmod->senone_scores[j] = SENSCR_DUMMY;
            
            if ((rv = fread(acmod->senone_scores + sen, 2, 1, senfh)) != 1)
                goto error_out;
            
            n = sen;
        }

        n++;
        while (n < bin_mdef_n_sen(acmod->mdef))
            acmod->senone_scores[n++] = SENSCR_DUMMY;
    }
    return 1;

error_out:
    if (ferror(senfh)) {
        E_ERROR_SYSTEM("Failed to read frame from senone file");
        return -1;
    }
    return 0;
}